

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O3

void * phasor_new(t_floatarg f)

{
  t_object *owner;
  t_symbol *ptVar1;
  
  owner = (t_object *)pd_new(phasor_class);
  *(t_floatarg *)((long)&owner[1].te_g.g_next + 4) = f;
  ptVar1 = gensym("ft1");
  inlet_new(owner,(t_pd *)owner,&s_float,ptVar1);
  owner[1].te_g.g_pd = (t_pd)0x0;
  *(undefined4 *)&owner[1].te_g.g_next = 0;
  ptVar1 = gensym("signal");
  outlet_new(owner,ptVar1);
  return owner;
}

Assistant:

static void *phasor_new(t_floatarg f)
{
    t_phasor *x = (t_phasor *)pd_new(phasor_class);
    x->x_f = f;
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_float, gensym("ft1"));
    x->x_phase = 0;
    x->x_conv = 0;
    outlet_new(&x->x_obj, gensym("signal"));
    return (x);
}